

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

bool CountLowbitsCollisions<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *revhashes,int nbLBits)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ushort uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  
  bVar6 = true;
  if (nbLBits < 0x20) {
    uVar9 = (long)(revhashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(revhashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 2;
    auVar21._0_8_ = (double)(int)uVar9;
    dVar19 = ldexp(1.0,nbLBits);
    auVar20._0_8_ = (auVar21._0_8_ * (double)((int)uVar9 + -1)) / dVar19;
    auVar20._8_8_ = 0;
    auVar21._8_8_ = 0;
    auVar20 = vminsd_avx(auVar21,auVar20);
    printf("Testing collisions (low  %2i-bit) - Expected %12.1f, ",(ulong)(uint)nbLBits);
    uVar8 = 0;
    if (1 < uVar9) {
      auVar12 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      puVar1 = (revhashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vpbroadcastd_avx512f();
      uVar7 = 0;
      do {
        auVar16 = vpbroadcastq_avx512f();
        auVar17 = vporq_avx512f(auVar16,auVar12);
        auVar16 = vporq_avx512f(auVar16,auVar13);
        uVar3 = vpcmpuq_avx512f(auVar16,auVar14,2);
        bVar4 = (byte)uVar3;
        uVar3 = vpcmpuq_avx512f(auVar17,auVar14,2);
        bVar5 = (byte)uVar3;
        uVar10 = CONCAT11(bVar5,bVar4);
        auVar16 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar1 + uVar7 + 1));
        auVar17._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar16._4_4_;
        auVar17._0_4_ = (uint)(bVar4 & 1) * auVar16._0_4_;
        auVar17._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar16._8_4_;
        auVar17._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar16._12_4_;
        auVar17._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar16._16_4_;
        auVar17._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar16._20_4_;
        auVar17._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar16._24_4_;
        auVar17._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar16._28_4_;
        auVar17._32_4_ = (uint)(bVar5 & 1) * auVar16._32_4_;
        auVar17._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar16._36_4_;
        auVar17._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar16._40_4_;
        auVar17._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar16._44_4_;
        auVar17._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar16._48_4_;
        auVar17._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar16._52_4_;
        auVar17._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar16._56_4_;
        auVar17._60_4_ = (uint)(bVar5 >> 7) * auVar16._60_4_;
        auVar16 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar1 + uVar7));
        auVar18._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar16._4_4_;
        auVar18._0_4_ = (uint)(bVar4 & 1) * auVar16._0_4_;
        auVar18._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar16._8_4_;
        auVar18._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar16._12_4_;
        auVar18._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar16._16_4_;
        auVar18._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar16._20_4_;
        auVar18._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar16._24_4_;
        auVar18._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar16._28_4_;
        auVar18._32_4_ = (uint)(bVar5 & 1) * auVar16._32_4_;
        auVar18._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar16._36_4_;
        auVar18._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar16._40_4_;
        auVar18._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar16._44_4_;
        auVar18._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar16._48_4_;
        auVar18._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar16._52_4_;
        auVar18._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar16._56_4_;
        auVar18._60_4_ = (uint)(bVar5 >> 7) * auVar16._60_4_;
        uVar7 = uVar7 + 0x10;
        auVar16 = vpsrlvd_avx512f(auVar18,auVar15);
        auVar17 = vpsrlvd_avx512f(auVar17,auVar15);
        auVar18 = vmovdqa64_avx512f(auVar22);
        uVar3 = vpcmpeqd_avx512f(auVar16,auVar17);
        auVar22 = vpmovm2d_avx512dq(uVar3);
        auVar22 = vpsubd_avx512f(auVar18,auVar22);
      } while ((uVar9 + 0xe & 0xfffffffffffffff0) != uVar7);
      auVar12 = vmovdqa32_avx512f(auVar22);
      auVar13._0_4_ = (uint)(bVar4 & 1) * auVar12._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar18._0_4_;
      bVar6 = (bool)((byte)(uVar10 >> 1) & 1);
      auVar13._4_4_ = (uint)bVar6 * auVar12._4_4_ | (uint)!bVar6 * auVar18._4_4_;
      bVar6 = (bool)((byte)(uVar10 >> 2) & 1);
      auVar13._8_4_ = (uint)bVar6 * auVar12._8_4_ | (uint)!bVar6 * auVar18._8_4_;
      bVar6 = (bool)((byte)(uVar10 >> 3) & 1);
      auVar13._12_4_ = (uint)bVar6 * auVar12._12_4_ | (uint)!bVar6 * auVar18._12_4_;
      bVar6 = (bool)((byte)(uVar10 >> 4) & 1);
      auVar13._16_4_ = (uint)bVar6 * auVar12._16_4_ | (uint)!bVar6 * auVar18._16_4_;
      bVar6 = (bool)((byte)(uVar10 >> 5) & 1);
      auVar13._20_4_ = (uint)bVar6 * auVar12._20_4_ | (uint)!bVar6 * auVar18._20_4_;
      bVar6 = (bool)((byte)(uVar10 >> 6) & 1);
      auVar13._24_4_ = (uint)bVar6 * auVar12._24_4_ | (uint)!bVar6 * auVar18._24_4_;
      bVar6 = (bool)((byte)(uVar10 >> 7) & 1);
      auVar13._28_4_ = (uint)bVar6 * auVar12._28_4_ | (uint)!bVar6 * auVar18._28_4_;
      auVar13._32_4_ =
           (uint)(bVar5 & 1) * auVar12._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar18._32_4_;
      bVar6 = (bool)(bVar5 >> 1 & 1);
      auVar13._36_4_ = (uint)bVar6 * auVar12._36_4_ | (uint)!bVar6 * auVar18._36_4_;
      bVar6 = (bool)(bVar5 >> 2 & 1);
      auVar13._40_4_ = (uint)bVar6 * auVar12._40_4_ | (uint)!bVar6 * auVar18._40_4_;
      bVar6 = (bool)(bVar5 >> 3 & 1);
      auVar13._44_4_ = (uint)bVar6 * auVar12._44_4_ | (uint)!bVar6 * auVar18._44_4_;
      bVar6 = (bool)(bVar5 >> 4 & 1);
      auVar13._48_4_ = (uint)bVar6 * auVar12._48_4_ | (uint)!bVar6 * auVar18._48_4_;
      bVar6 = (bool)(bVar5 >> 5 & 1);
      auVar13._52_4_ = (uint)bVar6 * auVar12._52_4_ | (uint)!bVar6 * auVar18._52_4_;
      bVar6 = (bool)(bVar5 >> 6 & 1);
      auVar13._56_4_ = (uint)bVar6 * auVar12._56_4_ | (uint)!bVar6 * auVar18._56_4_;
      auVar13._60_4_ =
           (uint)(bVar5 >> 7) * auVar12._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar18._60_4_;
      auVar11 = vextracti64x4_avx512f(auVar13,1);
      auVar12 = vpaddd_avx512f(auVar13,ZEXT3264(auVar11));
      auVar21 = vpaddd_avx(auVar12._0_16_,auVar12._16_16_);
      auVar2 = vpshufd_avx(auVar21,0xee);
      auVar21 = vpaddd_avx(auVar21,auVar2);
      auVar2 = vpshufd_avx(auVar21,0x55);
      auVar21 = vpaddd_avx(auVar21,auVar2);
      uVar8 = auVar21._0_4_;
    }
    dVar19 = (double)(int)uVar8 / auVar20._0_8_;
    printf("actual %6i (%.2fx)",(ulong)uVar8);
    if ((0.98 < dVar19) && (uVar8 = uVar8 - (int)auVar20._0_8_, uVar8 != 0)) {
      printf(" (%i)",(ulong)uVar8);
    }
    if (2.0 < dVar19) {
      puts(" !!!!!");
    }
    else {
      putchar(10);
    }
    bVar6 = 2.0 >= dVar19;
  }
  return bVar6;
}

Assistant:

bool CountLowbitsCollisions ( std::vector<hashtype> & revhashes, int nbLBits)
{
  const int origBits = sizeof(hashtype) * 8;
  int shiftBy = origBits - nbLBits;

  if (shiftBy <= 0) return true;

  size_t const nbH = revhashes.size();
  double expected = EstimateNbCollisions(nbH, nbLBits);
  printf("Testing collisions (low  %2i-bit) - Expected %12.1f, ", nbLBits, expected);
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
    hashtype const h1 = revhashes[hnb-1] >> shiftBy;
    hashtype const h2 = revhashes[hnb]   >> shiftBy;
    if(h1 == h2)
    {
      collcount++;
    }
  }

  printf("actual %6i (%.2fx)", collcount, collcount / expected);
  if (collcount/expected > 0.98 && collcount != (int)expected)
    printf(" (%i)", collcount - (int)expected);

  if(double(collcount) / double(expected) > 2.0)
  {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}